

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# valid.c
# Opt level: O2

void xmlFreeAttribute(xmlAttributePtr attr)

{
  int iVar1;
  xmlChar *pxVar2;
  _xmlDict *dict;
  
  if (attr == (xmlAttributePtr)0x0) {
    return;
  }
  if (attr->doc == (_xmlDoc *)0x0) {
    dict = (xmlDictPtr)0x0;
  }
  else {
    dict = attr->doc->dict;
  }
  xmlUnlinkNode((xmlNodePtr)attr);
  if (attr->tree != (xmlEnumerationPtr)0x0) {
    xmlFreeEnumeration(attr->tree);
  }
  pxVar2 = attr->elem;
  if (dict == (xmlDictPtr)0x0) {
    if (pxVar2 != (xmlChar *)0x0) {
      (*xmlFree)(pxVar2);
    }
    if (attr->name != (xmlChar *)0x0) {
      (*xmlFree)(attr->name);
    }
    if (attr->defaultValue != (xmlChar *)0x0) {
      (*xmlFree)(attr->defaultValue);
    }
    pxVar2 = attr->prefix;
    if (pxVar2 == (xmlChar *)0x0) goto LAB_001546e0;
  }
  else {
    if ((pxVar2 != (xmlChar *)0x0) && (iVar1 = xmlDictOwns(dict,pxVar2), iVar1 == 0)) {
      (*xmlFree)(attr->elem);
    }
    if ((attr->name != (xmlChar *)0x0) && (iVar1 = xmlDictOwns(dict,attr->name), iVar1 == 0)) {
      (*xmlFree)(attr->name);
    }
    if ((attr->prefix != (xmlChar *)0x0) && (iVar1 = xmlDictOwns(dict,attr->prefix), iVar1 == 0)) {
      (*xmlFree)(attr->prefix);
    }
    if ((attr->defaultValue == (xmlChar *)0x0) ||
       (iVar1 = xmlDictOwns(dict,attr->defaultValue), iVar1 != 0)) goto LAB_001546e0;
    pxVar2 = attr->defaultValue;
  }
  (*xmlFree)(pxVar2);
LAB_001546e0:
  (*xmlFree)(attr);
  return;
}

Assistant:

static void
xmlFreeAttribute(xmlAttributePtr attr) {
    xmlDictPtr dict;

    if (attr == NULL) return;
    if (attr->doc != NULL)
	dict = attr->doc->dict;
    else
	dict = NULL;
    xmlUnlinkNode((xmlNodePtr) attr);
    if (attr->tree != NULL)
        xmlFreeEnumeration(attr->tree);
    if (dict) {
        if ((attr->elem != NULL) && (!xmlDictOwns(dict, attr->elem)))
	    xmlFree((xmlChar *) attr->elem);
        if ((attr->name != NULL) && (!xmlDictOwns(dict, attr->name)))
	    xmlFree((xmlChar *) attr->name);
        if ((attr->prefix != NULL) && (!xmlDictOwns(dict, attr->prefix)))
	    xmlFree((xmlChar *) attr->prefix);
        if ((attr->defaultValue != NULL) &&
	    (!xmlDictOwns(dict, attr->defaultValue)))
	    xmlFree((xmlChar *) attr->defaultValue);
    } else {
	if (attr->elem != NULL)
	    xmlFree((xmlChar *) attr->elem);
	if (attr->name != NULL)
	    xmlFree((xmlChar *) attr->name);
	if (attr->defaultValue != NULL)
	    xmlFree((xmlChar *) attr->defaultValue);
	if (attr->prefix != NULL)
	    xmlFree((xmlChar *) attr->prefix);
    }
    xmlFree(attr);
}